

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FieldOptions::_InternalSerialize
          (FieldOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  FeatureSet *value;
  FieldOptions_FeatureSupport *value_00;
  bool bVar1;
  FieldOptions_CType value_01;
  FieldOptions_JSType value_02;
  FieldOptions_OptionRetention value_03;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint8_t *puVar6;
  RepeatedField<int> *this_00;
  const_reference piVar7;
  RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault> *this_01;
  const_reference this_02;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_03;
  const_reference this_04;
  FieldOptions *extendee;
  UnknownFieldSet *unknown_fields;
  UninterpretedOption *repfield_1;
  uint n_2;
  uint i_2;
  FieldOptions_EditionDefault *repfield;
  uint local_38;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32_t cached_has_bits;
  FieldOptions *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FieldOptions *this_local;
  
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar4 = *puVar5;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar4 & 4) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    value_01 = _internal_ctype(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(1,value_01,puVar6);
  }
  if ((uVar4 & 8) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_packed(this);
    stream_local = (EpsCopyOutputStream *)internal::WireFormatLite::WriteBoolToArray(2,bVar1,puVar6)
    ;
  }
  if ((uVar4 & 0x10) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_deprecated(this);
    stream_local = (EpsCopyOutputStream *)internal::WireFormatLite::WriteBoolToArray(3,bVar1,puVar6)
    ;
  }
  if ((uVar4 & 0x20) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_lazy(this);
    stream_local = (EpsCopyOutputStream *)internal::WireFormatLite::WriteBoolToArray(5,bVar1,puVar6)
    ;
  }
  if ((uVar4 & 0x80) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _internal_jstype(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(6,value_02,puVar6);
  }
  if ((uVar4 & 0x40) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_weak(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(10,bVar1,puVar6);
  }
  if ((uVar4 & 0x100) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_unverified_lazy(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0xf,bVar1,puVar6);
  }
  if ((uVar4 & 0x200) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    bVar1 = _internal_debug_redact(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteBoolToArray(0x10,bVar1,puVar6);
  }
  if ((uVar4 & 0x400) != 0) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_03 = _internal_retention(this);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(0x11,value_03,puVar6);
  }
  i_1 = 0;
  iVar2 = _internal_targets_size(this);
  for (; (int)i_1 < iVar2; i_1 = i_1 + 1) {
    puVar6 = protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    this_00 = _internal_targets(this);
    piVar7 = RepeatedField<int>::Get(this_00,i_1);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::WriteEnumToArray(0x13,*piVar7,puVar6);
  }
  local_38 = 0;
  uVar3 = _internal_edition_defaults_size(this);
  for (; local_38 < uVar3; local_38 = local_38 + 1) {
    this_01 = _internal_edition_defaults(this);
    this_02 = RepeatedPtrField<google::protobuf::FieldOptions_EditionDefault>::Get(this_01,local_38)
    ;
    iVar2 = FieldOptions_EditionDefault::GetCachedSize(this_02);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0x14,(MessageLite *)this_02,iVar2,(uint8_t *)stream_local,stream);
  }
  if ((uVar4 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    iVar2 = FeatureSet::GetCachedSize((this->field_0)._impl_.features_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0x15,(MessageLite *)value,iVar2,(uint8_t *)stream_local,stream);
  }
  if ((uVar4 & 2) != 0) {
    value_00 = (this->field_0)._impl_.feature_support_;
    iVar2 = FieldOptions_FeatureSupport::GetCachedSize((this->field_0)._impl_.feature_support_);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (0x16,(MessageLite *)value_00,iVar2,(uint8_t *)stream_local,stream);
  }
  repfield_1._4_4_ = 0;
  uVar4 = _internal_uninterpreted_option_size(this);
  for (; repfield_1._4_4_ < uVar4; repfield_1._4_4_ = repfield_1._4_4_ + 1) {
    this_03 = _internal_uninterpreted_option(this);
    this_04 = RepeatedPtrField<google::protobuf::UninterpretedOption>::Get(this_03,repfield_1._4_4_)
    ;
    iVar2 = UninterpretedOption::GetCachedSize(this_04);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormatLite::InternalWriteMessage
                             (999,(MessageLite *)this_04,iVar2,(uint8_t *)stream_local,stream);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar1 = internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_ctype(), target);
  }

  // optional bool packed = 2;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        2, this_._internal_packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        3, this_._internal_deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        5, this_._internal_lazy(), target);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        6, this_._internal_jstype(), target);
  }

  // optional bool weak = 10 [default = false];
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        10, this_._internal_weak(), target);
  }

  // optional bool unverified_lazy = 15 [default = false];
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        15, this_._internal_unverified_lazy(), target);
  }

  // optional bool debug_redact = 16 [default = false];
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        16, this_._internal_debug_redact(), target);
  }

  // optional .google.protobuf.FieldOptions.OptionRetention retention = 17;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        17, this_._internal_retention(), target);
  }

  // repeated .google.protobuf.FieldOptions.OptionTargetType targets = 19;
  for (int i = 0, n = this_._internal_targets_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        19, static_cast<::google::protobuf::FieldOptions_OptionTargetType>(this_._internal_targets().Get(i)),
        target);
  }

  // repeated .google.protobuf.FieldOptions.EditionDefault edition_defaults = 20;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_edition_defaults_size());
       i < n; i++) {
    const auto& repfield = this_._internal_edition_defaults().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            20, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // optional .google.protobuf.FeatureSet features = 21;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        21, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.FieldOptions.FeatureSupport feature_support = 22;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        22, *this_._impl_.feature_support_, this_._impl_.feature_support_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions)
  return target;
}